

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_cfile_stream.h
# Opt level: O3

bool __thiscall crnlib::cfile_stream::seek(cfile_stream *this,int64 ofs,bool relative)

{
  undefined1 *puVar1;
  int iVar2;
  ulong __off;
  uint64 uVar3;
  
  if ((((this->super_data_stream).field_0x1a & 1) != 0) &&
     (((this->super_data_stream).m_attribs & 4) != 0)) {
    uVar3 = 0;
    if (relative) {
      uVar3 = this->m_ofs;
    }
    __off = uVar3 + ofs;
    if ((long)__off < 0) {
      return false;
    }
    if (this->m_size < __off) {
      return false;
    }
    if (__off == this->m_ofs) {
      return true;
    }
    iVar2 = fseeko64((FILE *)this->m_pFile,__off,0);
    if (iVar2 == 0) {
      this->m_ofs = __off;
      return true;
    }
    puVar1 = &(this->super_data_stream).field_0x1a;
    *puVar1 = *puVar1 | 2;
  }
  return false;
}

Assistant:

virtual bool seek(int64 ofs, bool relative)
        {
            if ((!m_opened) || (!is_seekable()))
            {
                return false;
            }

            int64 new_ofs = relative ? (m_ofs + ofs) : ofs;
            if (new_ofs < 0)
            {
                return false;
            }
            else if (static_cast<uint64>(new_ofs) > m_size)
            {
                return false;
            }

            if (static_cast<uint64>(new_ofs) != m_ofs)
            {
                if (crn_fseek(m_pFile, new_ofs, SEEK_SET) != 0)
                {
                    set_error();
                    return false;
                }

                m_ofs = new_ofs;
            }

            return true;
        }